

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_socket.cpp
# Opt level: O2

void __thiscall async_writer::run(async_writer *this)

{
  int iVar1;
  stream_socket *psVar2;
  uint uVar3;
  reference pvVar4;
  vector<char,_std::allocator<char>_> *this_00;
  ulong __new_size;
  callback<void_(const_std::error_code_&,_unsigned_long)> local_88;
  const_buffer local_80;
  mutable_buffer local_50;
  
  uVar3 = 0;
  do {
    __new_size = (ulong)uVar3;
    this_00 = this->buf;
    if ((ulong)((long)(this_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(this_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_start) <= __new_size) {
LAB_0010fe89:
      psVar2 = this->sock;
      booster::aio::buffer(&local_50,this_00);
      booster::aio::const_buffer::const_buffer(&local_80,&local_50);
      booster::callback<void_(const_std::error_code_&,_unsigned_long)>::callback<async_writer>
                (&local_88,*this);
      booster::aio::stream_socket::async_write_some((const_buffer *)psVar2,(callback *)&local_80);
      booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::
      ~intrusive_ptr(&local_88.call_ptr);
      std::
      _Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
      ::~_Vector_base(&local_80.super_buffer_impl<const_char_*>.vec_.
                       super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                     );
      std::
      _Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
      ::~_Vector_base(&local_50.super_buffer_impl<char_*>.vec_.
                       super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                     );
      return;
    }
    iVar1 = this->counter;
    if (99999 < uVar3 + iVar1) {
      std::vector<char,_std::allocator<char>_>::resize(this_00,__new_size);
      this_00 = this->buf;
      goto LAB_0010fe89;
    }
    pvVar4 = std::vector<char,_std::allocator<char>_>::at(this_00,__new_size);
    *pvVar4 = (char)iVar1 + (char)((ulong)(iVar1 + uVar3) / 100) * -100 + (char)uVar3;
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

void run()
	{
		unsigned i;
		for(i=0;i<buf->size() && counter+i < 100000;i++)
			buf->at(i)=char((counter + i) % 100);
		if(i < buf->size())
			buf->resize(i);
		sock->async_write_some(io::buffer(*buf),*this);
	}